

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

TryStmt * new_try_stmt(void *block,List *stmts,void *finally)

{
  void *any;
  TryStmt *pTVar1;
  TreeNode *pTVar2;
  TryStmt *stmt;
  void *finally_local;
  List *stmts_local;
  void *block_local;
  
  any = malloc(0x28);
  pTVar1 = (TryStmt *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node((Token *)0x0,try_eval);
  (pTVar1->node).eval = pTVar2->eval;
  (pTVar1->node).token = pTVar2->token;
  pTVar1->block = block;
  pTVar1->stmts = stmts;
  pTVar1->stmt = finally;
  return pTVar1;
}

Assistant:

TryStmt *new_try_stmt(void *block, List *stmts, void *finally) {
    TryStmt *stmt = new(TryStmt);
    stmt->node = tree_node_(NULL, eval_handler(try_eval));
    stmt->block = block;
    stmt->stmts = stmts;
    stmt->stmt = finally;
    return stmt;
}